

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWRaster.cpp
# Opt level: O0

Cell * __thiscall TRM::SWRaster::find_cell(SWRaster *this)

{
  Cell *pCVar1;
  vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_> *this_00;
  size_type sVar2;
  mapped_type *pmVar3;
  Cell *pCVar4;
  reference pvVar5;
  Cell local_ac;
  Cell *local_a0;
  value_type local_94;
  __normal_iterator<TRM::SWRaster::Cell_*,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>
  local_88;
  __normal_iterator<TRM::SWRaster::Cell_*,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>
  local_80;
  const_iterator local_78;
  SWRaster *local_70;
  Cell *cell;
  size_t i;
  mapped_type *pmStack_58;
  int32_t index;
  mapped_type *list;
  value_type *cell_1;
  allocator<TRM::SWRaster::Cell> local_31;
  undefined1 local_30 [8];
  vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_> list_1;
  SWRaster *this_local;
  
  list_1.super__Vector_base<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = &this->curr_cell;
  sVar2 = std::
          unordered_map<int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>_>_>
          ::count(&this->m_cells_y,&this->m_ey);
  if (sVar2 == 0) {
    std::allocator<TRM::SWRaster::Cell>::allocator(&local_31);
    std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>::vector
              ((vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_> *)local_30,1,
               &local_31);
    std::allocator<TRM::SWRaster::Cell>::~allocator(&local_31);
    pmVar3 = std::
             unordered_map<int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>_>_>
             ::operator[](&this->m_cells_y,&this->m_ey);
    std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>::operator=
              (pmVar3,(vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_> *)local_30)
    ;
    pmVar3 = std::
             unordered_map<int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>_>_>
             ::operator[](&this->m_cells_y,&this->m_ey);
    this_local = (SWRaster *)
                 std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>::operator[]
                           (pmVar3,0);
    (this_local->curr_cell).x = this->m_ex;
    (this_local->curr_cell).area = 0;
    (this_local->curr_cell).cover = 0;
    list = (mapped_type *)this_local;
    std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>::~vector
              ((vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_> *)local_30);
  }
  else {
    pmStack_58 = std::
                 unordered_map<int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>_>_>
                 ::operator[](&this->m_cells_y,&this->m_ey);
    i._4_4_ = -1;
    for (cell = (Cell *)0x0; pCVar1 = cell,
        pCVar4 = (Cell *)std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>::
                         size(pmStack_58), pCVar1 < pCVar4; cell = (Cell *)((long)&cell->x + 1)) {
      pvVar5 = std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>::operator[]
                         (pmStack_58,(size_type)cell);
      if (pvVar5->x == this->m_ex) {
        pvVar5 = std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>::operator[]
                           (pmStack_58,(size_type)cell);
        return pvVar5;
      }
      pvVar5 = std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>::operator[]
                         (pmStack_58,(size_type)cell);
      if (this->m_ex < pvVar5->x) {
        i._4_4_ = (int)cell;
        break;
      }
    }
    this_00 = pmStack_58;
    local_70 = (SWRaster *)0x0;
    if (i._4_4_ == -1) {
      local_ac.x = 0;
      local_ac.cover = 0;
      local_ac.area = 0;
      std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>::
      emplace_back<TRM::SWRaster::Cell>(pmStack_58,&local_ac);
      local_70 = (SWRaster *)
                 std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>::back
                           (pmStack_58);
    }
    else {
      local_88._M_current =
           (Cell *)std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>::begin
                             (pmStack_58);
      local_80 = __gnu_cxx::
                 __normal_iterator<TRM::SWRaster::Cell_*,_std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>_>
                 ::operator+(&local_88,(long)i._4_4_);
      __gnu_cxx::
      __normal_iterator<TRM::SWRaster::Cell_const*,std::vector<TRM::SWRaster::Cell,std::allocator<TRM::SWRaster::Cell>>>
      ::__normal_iterator<TRM::SWRaster::Cell*>
                ((__normal_iterator<TRM::SWRaster::Cell_const*,std::vector<TRM::SWRaster::Cell,std::allocator<TRM::SWRaster::Cell>>>
                  *)&local_78,&local_80);
      local_94.x = 0;
      local_94.cover = 0;
      local_94.area = 0;
      local_a0 = (Cell *)std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>::
                         insert(this_00,local_78,&local_94);
      local_70 = (SWRaster *)
                 std::vector<TRM::SWRaster::Cell,_std::allocator<TRM::SWRaster::Cell>_>::operator[]
                           (pmStack_58,(long)i._4_4_);
    }
    (local_70->curr_cell).x = this->m_ex;
    (local_70->curr_cell).area = 0;
    (local_70->curr_cell).cover = 0;
    this_local = local_70;
  }
  return &this_local->curr_cell;
}

Assistant:

SWRaster::Cell* SWRaster::find_cell() {
  if (m_cells_y.count(m_ey) == 0) {
    std::vector<Cell> list(1);
    m_cells_y[m_ey] = list;

    auto cell = &m_cells_y[m_ey][0];
    cell->x = m_ex;
    cell->area = 0;
    cell->cover = 0;
    return cell;
  }

  auto& list = m_cells_y[m_ey];

  int32_t index = -1;
  for (size_t i = 0; i < list.size(); i++) {
    if (list[i].x == m_ex) {
      return &list[i];
    }

    if (list[i].x > m_ex) {
      index = i;
      break;
    }
  }

  Cell* cell = nullptr;
  if (index != -1) {
    list.insert(list.begin() + index, Cell{});
    cell = &list[index];
  } else {
    list.emplace_back(Cell{});
    cell = &list.back();
  }

  cell->x = m_ex;
  cell->area = 0;
  cell->cover = 0;

  return cell;
}